

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqTable.cpp
# Opt level: O2

void __thiscall FreqTable::initCum(FreqTable *this)

{
  double *pdVar1;
  double *freq;
  double *pdVar2;
  double sum;
  vector<double,_std::allocator<double>_> cumul;
  value_type_conflict2 local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  double local_30;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)&local_48,0x101);
  local_50 = 0.0;
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)&local_48,&local_30);
  pdVar1 = (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (this->frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    local_50 = local_50 + *pdVar2;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_48,&local_50);
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->cumulative,(vector<double,_std::allocator<double>_> *)&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void FreqTable::initCum() {
    vector<double> cumul;
    cumul.reserve(257);
    double sum = 0;
    cumul.push_back(0);
    for (const auto &freq : frequencies) {
        sum += freq;
        cumul.push_back(sum);
    }
    cumulative = cumul;
}